

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void RescalerImportRowShrink_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  int iVar1;
  uint uVar2;
  undefined7 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  unkbyte10 Var6;
  unkbyte10 Var7;
  int iVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  rescaler_t *prVar12;
  rescaler_t *prVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar23;
  short sVar25;
  short sVar26;
  undefined1 auVar24 [16];
  ushort uVar27;
  byte bVar30;
  short sVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uVar35;
  short sVar36;
  undefined1 auVar34 [16];
  undefined4 uVar37;
  
  if (wrk->num_channels == 4) {
    uVar20 = wrk->x_sub;
    iVar1 = wrk->x_add;
    if (iVar1 <= (int)(uVar20 * 0x80)) {
      auVar21 = pshuflw(ZEXT416(uVar20),ZEXT416(uVar20),0);
      auVar22._0_4_ = auVar21._0_4_;
      auVar22._4_4_ = auVar22._0_4_;
      auVar22._8_4_ = auVar22._0_4_;
      auVar22._12_4_ = auVar22._0_4_;
      uVar2 = wrk->fx_scale;
      prVar12 = wrk->frow;
      prVar13 = prVar12 + (long)wrk->dst_width * 4;
      iVar14 = 0;
      auVar24 = (undefined1  [16])0x0;
      for (; prVar12 < prVar13; prVar12 = prVar12 + 4) {
        iVar14 = iVar14 + iVar1;
        uVar16 = -iVar14;
        auVar28 = (undefined1  [16])0x0;
        while( true ) {
          sVar23 = auVar24._0_2_;
          sVar25 = auVar24._2_2_;
          sVar26 = auVar24._4_2_;
          sVar31 = auVar24._6_2_;
          if (iVar14 < 1) break;
          uVar35 = *(undefined4 *)src;
          src = src + 4;
          bVar30 = (byte)((uint)uVar35 >> 0x18);
          uVar3 = CONCAT25((short)(((uint7)bVar30 << 0x30) >> 0x28),
                           CONCAT14((char)((uint)uVar35 >> 0x10),uVar35));
          uVar27 = (ushort)uVar35;
          uVar11 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar3 >> 0x20),uVar35) >> 0x18),
                                   CONCAT12((char)((uint)uVar35 >> 8),uVar27)) & 0xffffffff00ffffff;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = CONCAT62((int6)(uVar11 >> 0x10),uVar27) & 0xffffffffffff00ff;
          auVar24._0_2_ = sVar23 + (uVar27 & 0xff);
          auVar24._2_2_ = sVar25 + (short)(uVar11 >> 0x10);
          auVar24._4_2_ = sVar26 + (short)((uint7)uVar3 >> 0x20);
          auVar24._6_2_ = sVar31 + (ushort)bVar30;
          iVar14 = iVar14 - uVar20;
          uVar16 = uVar16 + uVar20;
        }
        auVar32 = pshuflw(ZEXT416(uVar16),ZEXT416(uVar16),0);
        auVar33._0_4_ = auVar32._0_4_;
        auVar33._4_4_ = auVar33._0_4_;
        auVar33._8_4_ = auVar33._0_4_;
        auVar33._12_4_ = auVar33._0_4_;
        sVar36 = auVar32._2_2_ * auVar28._6_2_;
        auVar29 = pmulhuw(auVar28,auVar33);
        iVar8 = CONCAT22(auVar29._6_2_,sVar36);
        Var6 = CONCAT64(CONCAT42(iVar8,auVar29._4_2_),CONCAT22(auVar32._0_2_ * auVar28._4_2_,sVar36)
                       );
        uVar11 = (ulong)((unkuint10)Var6 >> 0x10);
        auVar4._4_8_ = uVar11;
        auVar4._2_2_ = auVar29._2_2_;
        auVar4._0_2_ = auVar32._2_2_ * auVar28._2_2_;
        auVar34._0_4_ = CONCAT22(auVar29._0_2_,auVar32._0_2_ * auVar28._0_2_);
        auVar34._4_12_ = auVar4;
        sVar31 = sVar31 * auVar21._2_2_;
        auVar28 = pmulhuw(auVar24,auVar22);
        iVar9 = CONCAT22(auVar28._6_2_,sVar31);
        Var7 = CONCAT64(CONCAT42(iVar9,auVar28._4_2_),CONCAT22(sVar26 * auVar21._0_2_,sVar31));
        auVar5._4_8_ = (long)((unkuint10)Var7 >> 0x10);
        auVar5._2_2_ = auVar28._2_2_;
        auVar5._0_2_ = sVar25 * auVar21._2_2_;
        uVar35 = (undefined4)((ulong)auVar34._0_4_ * (ulong)uVar2 + 0x80000000 >> 0x20);
        uVar37 = (undefined4)((uVar11 & 0xffffffff) * (ulong)uVar2 + 0x80000000 >> 0x20);
        auVar32._4_4_ = uVar37;
        auVar32._0_4_ = uVar35;
        auVar32._8_4_ = uVar37;
        auVar32._12_4_ = (int)((uVar11 >> 0x20) * (ulong)uVar2 + 0x80000000 >> 0x20);
        auVar29._8_8_ = auVar32._8_8_;
        auVar29._4_4_ = (int)((auVar34._0_8_ >> 0x20) * (ulong)uVar2 + 0x80000000 >> 0x20);
        auVar29._0_4_ = uVar35;
        auVar24 = packssdw(auVar29,(undefined1  [16])0x0);
        *prVar12 = CONCAT22(auVar28._0_2_,sVar23 * auVar21._0_2_) - auVar34._0_4_;
        prVar12[1] = auVar5._0_4_ - auVar4._0_4_;
        prVar12[2] = (int)((unkuint10)Var7 >> 0x10) - (int)((unkuint10)Var6 >> 0x10);
        prVar12[3] = iVar9 - iVar8;
      }
      return;
    }
  }
  uVar20 = wrk->num_channels;
  lVar10 = (long)(int)uVar20;
  iVar1 = wrk->dst_width;
  uVar11 = 0;
  uVar15 = 0;
  if (0 < (int)uVar20) {
    uVar15 = (ulong)uVar20;
  }
  for (; uVar11 != uVar15; uVar11 = uVar11 + 1) {
    uVar18 = 0;
    iVar14 = 0;
    uVar19 = uVar11;
    for (uVar17 = uVar11; (long)uVar17 < iVar1 * lVar10; uVar17 = uVar17 + lVar10) {
      uVar19 = (ulong)(int)uVar19;
      uVar20 = 0;
      for (iVar14 = iVar14 + wrk->x_add; 0 < iVar14; iVar14 = iVar14 - wrk->x_sub) {
        uVar20 = (uint)src[uVar19];
        uVar18 = (ulong)((int)uVar18 + (uint)src[uVar19]);
        uVar19 = uVar19 + lVar10;
      }
      wrk->frow[uVar17] = (int)uVar18 * wrk->x_sub + uVar20 * iVar14;
      uVar18 = (ulong)wrk->fx_scale * (ulong)-(uVar20 * iVar14) + 0x80000000 >> 0x20;
    }
  }
  return;
}

Assistant:

static void RescalerImportRowShrink_SSE2(WebPRescaler* WEBP_RESTRICT const wrk,
                                         const uint8_t* WEBP_RESTRICT src) {
  const int x_sub = wrk->x_sub;
  int accum = 0;
  const __m128i zero = _mm_setzero_si128();
  const __m128i mult0 = _mm_set1_epi16(x_sub);
  const __m128i mult1 = _mm_set1_epi32(wrk->fx_scale);
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  __m128i sum = zero;
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = wrk->frow + 4 * wrk->dst_width;

  if (wrk->num_channels != 4 || wrk->x_add > (x_sub << 7)) {
    WebPRescalerImportRowShrink_C(wrk, src);
    return;
  }
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);

  for (; frow < frow_end; frow += 4) {
    __m128i base = zero;
    accum += wrk->x_add;
    while (accum > 0) {
      const __m128i A = _mm_cvtsi32_si128(WebPMemToInt32(src));
      src += 4;
      base = _mm_unpacklo_epi8(A, zero);
      // To avoid overflow, we need: base * x_add / x_sub < 32768
      // => x_add < x_sub << 7. That's a 1/128 reduction ratio limit.
      sum = _mm_add_epi16(sum, base);
      accum -= x_sub;
    }
    {    // Emit next horizontal pixel.
      const __m128i mult = _mm_set1_epi16(-accum);
      const __m128i frac0 = _mm_mullo_epi16(base, mult);  // 16b x 16b -> 32b
      const __m128i frac1 = _mm_mulhi_epu16(base, mult);
      const __m128i frac = _mm_unpacklo_epi16(frac0, frac1);  // frac is 32b
      const __m128i A0 = _mm_mullo_epi16(sum, mult0);
      const __m128i A1 = _mm_mulhi_epu16(sum, mult0);
      const __m128i B0 = _mm_unpacklo_epi16(A0, A1);      // sum * x_sub
      const __m128i frow_out = _mm_sub_epi32(B0, frac);   // sum * x_sub - frac
      const __m128i D0 = _mm_srli_epi64(frac, 32);
      const __m128i D1 = _mm_mul_epu32(frac, mult1);      // 32b x 16b -> 64b
      const __m128i D2 = _mm_mul_epu32(D0, mult1);
      const __m128i E1 = _mm_add_epi64(D1, rounder);
      const __m128i E2 = _mm_add_epi64(D2, rounder);
      const __m128i F1 = _mm_shuffle_epi32(E1, 1 | (3 << 2));
      const __m128i F2 = _mm_shuffle_epi32(E2, 1 | (3 << 2));
      const __m128i G = _mm_unpacklo_epi32(F1, F2);
      sum = _mm_packs_epi32(G, zero);
      _mm_storeu_si128((__m128i*)frow, frow_out);
    }
  }
  assert(accum == 0);
}